

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O0

void __thiscall
QPDFWriter::unparseChild(QPDFWriter *this,QPDFObjectHandle *child,int level,int flags)

{
  bool bVar1;
  element_type *peVar2;
  Object *pOVar3;
  QPDFObjectHandle local_a0;
  string_view local_90;
  QPDFObjectHandle local_80;
  string local_70;
  string_view local_50;
  QPDFObjectHandle local_30;
  int local_20;
  int local_1c;
  int flags_local;
  int level_local;
  QPDFObjectHandle *child_local;
  QPDFWriter *this_local;
  
  local_20 = flags;
  local_1c = level;
  _flags_local = child;
  child_local = (QPDFObjectHandle *)this;
  peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)this);
  if ((peVar2->linearized & 1U) == 0) {
    QPDFObjectHandle::QPDFObjectHandle(&local_30,child);
    enqueueObject(this,&local_30);
    QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  }
  bVar1 = QPDFObjectHandle::isIndirect(child);
  if (bVar1) {
    peVar2 = std::__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<QPDFWriter::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    QPDFObjectHandle::QPDFObjectHandle(&local_80,child);
    pOVar3 = ObjTable<QPDFWriter::Object>::operator[]
                       (&(peVar2->obj).super_ObjTable<QPDFWriter::Object>,&local_80);
    std::__cxx11::to_string(&local_70,pOVar3->renumber);
    local_50 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_70);
    writeString(this,local_50);
    std::__cxx11::string::~string((string *)&local_70);
    QPDFObjectHandle::~QPDFObjectHandle(&local_80);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_90," 0 R");
    writeString(this,local_90);
  }
  else {
    QPDFObjectHandle::QPDFObjectHandle(&local_a0,child);
    unparseObject(this,&local_a0,local_1c,local_20,0,false);
    QPDFObjectHandle::~QPDFObjectHandle(&local_a0);
  }
  return;
}

Assistant:

void
QPDFWriter::unparseChild(QPDFObjectHandle child, int level, int flags)
{
    if (!m->linearized) {
        enqueueObject(child);
    }
    if (child.isIndirect()) {
        writeString(std::to_string(m->obj[child].renumber));
        writeString(" 0 R");
    } else {
        unparseObject(child, level, flags);
    }
}